

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBase.cpp
# Opt level: O2

void Diligent::ValidateCopyTextureParams(CopyTextureAttribs *CopyAttribs)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char (*in_RCX) [73];
  ITexture *pIVar3;
  Box *Box;
  Box SrcBox;
  string msg;
  undefined1 local_78 [32];
  undefined1 local_58 [48];
  
  pIVar3 = CopyAttribs->pSrcTexture;
  if ((pIVar3 == (ITexture *)0x0) || (CopyAttribs->pDstTexture == (ITexture *)0x0)) {
    FormatString<char[26],char[73]>
              ((string *)local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "CopyAttribs.pSrcTexture != nullptr && CopyAttribs.pDstTexture != nullptr",in_RCX);
    DebugAssertionFailed
              ((Char *)CONCAT44(local_58._4_4_,local_58._0_4_),"ValidateCopyTextureParams",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x1b2);
    std::__cxx11::string::~string((string *)local_58);
    pIVar3 = CopyAttribs->pSrcTexture;
  }
  local_78._0_4_ = 0;
  local_78._4_4_ = 0;
  local_78._8_4_ = 0;
  local_78._12_4_ = 0;
  local_78._16_4_ = 0;
  local_78._20_4_ = 1;
  iVar1 = (*(pIVar3->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  iVar2 = (*(CopyAttribs->pDstTexture->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  Box = CopyAttribs->pSrcBox;
  if (CopyAttribs->pSrcBox == (Box *)0x0) {
    GetMipLevelProperties
              ((MipLevelProperties *)local_58,(TextureDesc *)CONCAT44(extraout_var,iVar1),
               CopyAttribs->SrcMipLevel);
    local_78._4_4_ = local_58._0_4_;
    local_78._12_4_ = local_58._4_4_;
    local_78._20_4_ = local_58._16_4_;
    Box = (Box *)local_78;
  }
  ValidateTextureRegion
            ((TextureDesc *)CONCAT44(extraout_var,iVar1),CopyAttribs->SrcMipLevel,
             CopyAttribs->SrcSlice,Box);
  local_58._0_4_ = CopyAttribs->DstX;
  local_58._8_4_ = CopyAttribs->DstY;
  local_58._16_4_ = CopyAttribs->DstZ;
  local_58._4_4_ = (CopyAttribs->DstX + Box->MaxX) - Box->MinX;
  local_58._12_4_ = (CopyAttribs->DstY + Box->MaxY) - Box->MinY;
  local_58._20_4_ = (CopyAttribs->DstZ + Box->MaxZ) - Box->MinZ;
  ValidateTextureRegion
            ((TextureDesc *)CONCAT44(extraout_var_00,iVar2),CopyAttribs->DstMipLevel,
             CopyAttribs->DstSlice,(Box *)local_58);
  return;
}

Assistant:

void ValidateCopyTextureParams(const CopyTextureAttribs& CopyAttribs)
{
    VERIFY_EXPR(CopyAttribs.pSrcTexture != nullptr && CopyAttribs.pDstTexture != nullptr);
    Box                SrcBox;
    const TextureDesc& SrcTexDesc = CopyAttribs.pSrcTexture->GetDesc();
    const TextureDesc& DstTexDesc = CopyAttribs.pDstTexture->GetDesc();
    const Box*         pSrcBox    = CopyAttribs.pSrcBox;
    if (pSrcBox == nullptr)
    {
        MipLevelProperties MipLevelAttribs = GetMipLevelProperties(SrcTexDesc, CopyAttribs.SrcMipLevel);

        SrcBox.MaxX = MipLevelAttribs.LogicalWidth;
        SrcBox.MaxY = MipLevelAttribs.LogicalHeight;
        SrcBox.MaxZ = MipLevelAttribs.Depth;
        pSrcBox     = &SrcBox;
    }
    ValidateTextureRegion(SrcTexDesc, CopyAttribs.SrcMipLevel, CopyAttribs.SrcSlice, *pSrcBox);

    Box DstBox;
    DstBox.MinX = CopyAttribs.DstX;
    DstBox.MinY = CopyAttribs.DstY;
    DstBox.MinZ = CopyAttribs.DstZ;
    DstBox.MaxX = DstBox.MinX + pSrcBox->Width();
    DstBox.MaxY = DstBox.MinY + pSrcBox->Height();
    DstBox.MaxZ = DstBox.MinZ + pSrcBox->Depth();
    ValidateTextureRegion(DstTexDesc, CopyAttribs.DstMipLevel, CopyAttribs.DstSlice, DstBox);
}